

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

anon_unknown_2 * __thiscall
gflags::anon_unknown_2::GetLongFlagLine
          (anon_unknown_2 *this,string *line_indentation,CommandLineFlagInfo *info)

{
  int iVar1;
  ulong uVar2;
  string *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int missing_spaces;
  int newline_pos;
  size_type newline;
  string local_118 [32];
  ulong local_f8;
  size_type newlines;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  string local_78 [48];
  string local_48 [8];
  string old_flagname;
  CommandLineFlagInfo *info_local;
  string *line_indentation_local;
  string *output;
  
  DescribeOneFlag_abi_cxx11_((gflags *)this,info);
  std::operator+((char *)local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17a7db);
  uVar2 = std::__cxx11::string::find((string *)this,(ulong)local_48);
  psVar3 = (string *)std::__cxx11::string::size();
  std::operator+((char *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x17a7db);
  std::__cxx11::string::replace((ulong)this,uVar2,psVar3);
  std::__cxx11::string::~string(local_78);
  uVar2 = std::__cxx11::string::find((char *)this,0x17a84e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"\n    ",&local_99);
  std::__cxx11::string::replace((ulong)this,uVar2,(string *)0x1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  uVar2 = std::__cxx11::string::find((char *)this,0x17a855);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"\n    ",&local_c1);
  std::__cxx11::string::replace((ulong)this,uVar2,(string *)0x1);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  uVar6 = std::__cxx11::string::c_str();
  uVar7 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_
            ((char *)local_e8,"%s Details for \'--%s\':\n%s    defined: %s",uVar4,uVar5,uVar6,uVar7)
  ;
  std::__cxx11::string::operator=((string *)this,local_e8);
  std::__cxx11::string::~string(local_e8);
  if (((anonymous_namespace)::
       GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)::
       line_of_spaces_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)
                                   ::line_of_spaces_abi_cxx11_), iVar1 != 0)) {
    uVar2 = (ulong)fLI::FLAGS_tab_completion_columns;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               (anonymous_namespace)::
               GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)::
               line_of_spaces_abi_cxx11_,uVar2,' ',(allocator *)((long)&newlines + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&newlines + 7));
    __cxa_atexit(std::__cxx11::string::~string,
                 (anonymous_namespace)::
                 GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)::
                 line_of_spaces_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         GetLongFlagLine(std::__cxx11::string_const&,gflags::CommandLineFlagInfo_const&)
                         ::line_of_spaces_abi_cxx11_);
  }
  local_f8 = std::__cxx11::string::find((char *)this,0x17a8a3);
  while (uVar2 = local_f8, local_f8 != 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"\n",(allocator *)((long)&newline + 7));
    std::__cxx11::string::replace((ulong)this,uVar2,(string *)0x7);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&newline + 7));
    local_f8 = std::__cxx11::string::find((char *)this,0x17a8a3);
  }
  _missing_spaces = std::__cxx11::string::find((char)this,10);
  while (_missing_spaces != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)this,_missing_spaces,(string *)0x1,0x19e1f8,1);
    _missing_spaces = std::__cxx11::string::find((char)this,10);
  }
  std::__cxx11::string::~string(local_48);
  return this;
}

Assistant:

static string GetLongFlagLine(
    const string &line_indentation,
    const CommandLineFlagInfo &info) {

  string output = DescribeOneFlag(info);

  // Replace '-' with '--', and remove trailing newline before appending
  // the module definition location.
  string old_flagname = "-" + info.name;
  output.replace(
      output.find(old_flagname),
      old_flagname.size(),
      "-" + old_flagname);
  // Stick a newline and indentation in front of the type and default
  // portions of DescribeOneFlag()s description
  static const char kNewlineWithIndent[] = "\n    ";
  output.replace(output.find(" type:"), 1, string(kNewlineWithIndent));
  output.replace(output.find(" default:"), 1, string(kNewlineWithIndent));
  output = StringPrintf("%s Details for '--%s':\n"
                        "%s    defined: %s",
                        line_indentation.c_str(),
                        info.name.c_str(),
                        output.c_str(),
                        info.filename.c_str());

  // Eliminate any doubled newlines that crept in.  Specifically, if
  // DescribeOneFlag() decided to break the line just before "type"
  // or "default", we don't want to introduce an extra blank line
  static const string line_of_spaces(FLAGS_tab_completion_columns, ' ');
  static const char kDoubledNewlines[] = "\n     \n";
  for (string::size_type newlines = output.find(kDoubledNewlines);
      newlines != string::npos;
      newlines = output.find(kDoubledNewlines))
    // Replace each 'doubled newline' with a single newline
    output.replace(newlines, sizeof(kDoubledNewlines) - 1, string("\n"));

  for (string::size_type newline = output.find('\n');
      newline != string::npos;
      newline = output.find('\n')) {
    int newline_pos = static_cast<int>(newline) % FLAGS_tab_completion_columns;
    int missing_spaces = FLAGS_tab_completion_columns - newline_pos;
    output.replace(newline, 1, line_of_spaces, 1, missing_spaces);
  }
  return output;
}